

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  Type TVar4;
  pointer pNVar5;
  PolymeshInfo *polymesh;
  double dVar6;
  double dVar7;
  Scene *pSVar8;
  Matrix4x4 *transform;
  Matrix4x4 *transform_00;
  long lVar9;
  Application *this_00;
  size_t i;
  ulong uVar10;
  double local_190;
  double local_188;
  double local_180;
  double local_170;
  Vector4D local_168;
  double local_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  Vector3D camPos;
  PolymeshInfo *local_f0;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  lights;
  BBox bbox;
  _Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  local_60;
  _Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  local_48;
  
  camPos.x = 0.0;
  camPos.y = 0.0;
  camPos.z = 0.0;
  lights.
  super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lights.
  super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lights.
  super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects.
  super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects.
  super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objects.
  super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188 = 0.0;
  lVar9 = 0x48;
  local_190 = 0.0;
  local_180 = 0.0;
  this_00 = this;
  for (uVar10 = 0;
      pNVar5 = (sceneInfo->nodes).
               super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)(((long)(sceneInfo->nodes).
                              super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar5) / 200);
      uVar10 = uVar10 + 1) {
    polymesh = *(PolymeshInfo **)((long)(pNVar5->transform).entries + lVar9 + -0x50);
    transform_00 = (Matrix4x4 *)((long)(pNVar5->transform).entries + lVar9 + -0x48);
    TVar4 = (polymesh->super_Instance).type;
    if (TVar4 == POLYMESH) {
      bbox.max.x = (double)initPolymesh(this_00,polymesh,transform_00);
      this_00 = (Application *)&objects;
      std::
      vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>::
      emplace_back<CS248::DynamicScene::SceneObject*>
                ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                  *)this_00,(SceneObject **)&bbox);
    }
    else if (TVar4 == LIGHT) {
      bbox.max.x = (double)initLight(this_00,(LightInfo *)polymesh,transform_00);
      this_00 = (Application *)&lights;
      std::vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
      ::emplace_back<CS248::DynamicScene::SceneLight*>
                ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                  *)this_00,(SceneLight **)&bbox);
    }
    else if (TVar4 == CAMERA) {
      local_168.x = (double)(polymesh->vertices).
                            super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      local_168.y = (double)(polymesh->vertices).
                            super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
      local_168.z = (double)(polymesh->vertices).
                            super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_168.w = 1.0;
      Matrix4x4::operator*(transform_00,&local_168);
      Vector4D::to3D((Vector4D *)&bbox);
      camPos.z = local_120;
      camPos.x = local_130;
      camPos.y = dStack_128;
      local_168.x = (double)(polymesh->normals).
                            super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      local_168.y = (double)(polymesh->normals).
                            super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
      local_168.z = (double)(polymesh->normals).
                            super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_168.w = 1.0;
      Matrix4x4::operator*(transform_00,&local_168);
      Vector4D::to3D((Vector4D *)&bbox);
      dVar7 = local_120;
      local_190 = dStack_128;
      local_180 = local_130;
      this_00 = this;
      initCamera(this,(CameraInfo *)polymesh,transform);
      local_188 = 1.0 / SQRT(dVar7 * dVar7 + local_180 * local_180 + local_190 * local_190);
      local_180 = local_180 * local_188;
      local_190 = local_190 * local_188;
      local_188 = local_188 * dVar7;
      local_f0 = polymesh;
    }
    lVar9 = lVar9 + 200;
  }
  pSVar8 = (Scene *)operator_new(0x630);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector((vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)&local_48,&objects);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector((vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)&local_60,&lights);
  DynamicScene::Scene::Scene
            (pSVar8,(vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                     *)&local_48,
             (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
              *)&local_60,&sceneInfo->base_shader_dir);
  this->scene = pSVar8;
  std::
  _Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~_Vector_base(&local_60);
  std::
  _Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::~_Vector_base(&local_48);
  pSVar8 = this->scene;
  pSVar8->camera_ = &this->camera;
  DynamicScene::Scene::getBBox(&bbox,pSVar8);
  if (bbox.min.x <= bbox.max.x) {
    if (bbox.min.y <= bbox.max.y) {
      if (bbox.min.z <= bbox.max.z) {
        local_168.z = (bbox.min.z + bbox.max.z) * 0.5;
        dVar7 = (bbox.max.y + bbox.min.y) * 0.5;
        local_168.y._0_4_ = SUB84(dVar7,0);
        local_168.x = (bbox.max.x + bbox.min.x) * 0.5;
        local_168.y._4_4_ = (int)((ulong)dVar7 >> 0x20);
        local_138 = SQRT(bbox.extent.z * bbox.extent.z +
                         bbox.extent.x * bbox.extent.x + bbox.extent.y * bbox.extent.y) * 0.5 * 1.5;
        this->canonicalViewDistance = local_138;
        local_140 = local_138 / 10.0;
        local_170 = local_138 + local_138;
        local_138 = local_138 * 20.0;
        dVar7 = acos(local_190);
        dVar6 = atan2(local_180,local_188);
        Camera::place(&this->canonicalCamera,(Vector3D *)&local_168,dVar7,dVar6,local_170,local_140,
                      local_138);
        if (*(char *)&(local_f0->polygons).
                      super__Vector_base<CS248::Collada::Polygon,_std::allocator<CS248::Collada::Polygon>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
          local_168.z = camPos.z;
          local_168.y = camPos.y;
          local_168.x = camPos.x;
          pVVar1 = (local_f0->normals).
                   super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pVVar2 = (local_f0->normals).
                   super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pVVar3 = (local_f0->normals).
                   super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          local_170 = SQRT((double)pVVar3 * (double)pVVar3 +
                           (double)pVVar1 * (double)pVVar1 + (double)pVVar2 * (double)pVVar2);
        }
        dVar7 = acos(local_190);
        dVar6 = atan2(local_180,local_188);
        Camera::place(&this->camera,(Vector3D *)&local_168,dVar7,dVar6,local_170,local_140,local_138
                     );
        this->scrollRate = this->canonicalViewDistance / 10.0;
      }
    }
  }
  std::
  _Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::~_Vector_base(&objects.
                   super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                 );
  std::
  _Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~_Vector_base(&lights.
                   super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                 );
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

    // save camera position to update camera control later
    CameraInfo* camInfo;
    Vector3D camPos, camDir;
 
    vector<DynamicScene::SceneLight*> lights;
    vector<DynamicScene::SceneObject*> objects;

    vector<Collada::Node>& nodes = sceneInfo->nodes;

    for (size_t i=0; i<nodes.size(); i++) {
        Collada::Node& node = nodes[i];
        Collada::Instance* instance = node.instance;
        const Matrix4x4& transform = node.transform;

        switch (instance->type) {
          case Collada::Instance::CAMERA: {
              // printf("Creating camera\n"); fflush(stdout);
              camInfo = static_cast<CameraInfo*>(instance);
              camPos = (transform * Vector4D(camInfo->pos, 1)).to3D();
              camDir = (transform * Vector4D(camInfo->view_dir, 1)).to3D().unit();
              initCamera(*camInfo, transform);
              break;
          }
          case Collada::Instance::LIGHT: {
              // printf("Creating light\n"); fflush(stdout);  
              lights.push_back(
                  initLight(static_cast<LightInfo&>(*instance), transform));
              break;
          }
          case Collada::Instance::POLYMESH: {
              // printf("Creating mesh\n"); fflush(stdout);  
              objects.push_back(
                  initPolymesh(static_cast<PolymeshInfo&>(*instance), transform));
              break;
          }
        default:
            // unsupported instance type
            break;
        }
    }

    // create the scene
    scene = new DynamicScene::Scene(objects, lights, sceneInfo->base_shader_dir);
    scene->setCamera(&camera);  

    // given the size of the scene, determine a "canonical" camera position that's
    // outside the bounds of the scene's geometry
    BBox bbox = scene->getBBox();
    if (!bbox.empty()) {
        Vector3D target = bbox.centroid();
        canonicalViewDistance = bbox.extent.norm() / 2.0 * 1.5;

        double viewDistance = canonicalViewDistance * 2;
        double minViewDistance = canonicalViewDistance / 10.0;
        double maxViewDistance = canonicalViewDistance * 20.0;

      	canonicalCamera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                              viewDistance, minViewDistance, maxViewDistance);

    	  if (!camInfo->default_flag) {
		        target = camPos;
		        viewDistance = camInfo->view_dir.norm();
        }

        camera.place(target, acos(camDir.y), atan2(camDir.x, camDir.z),
                     viewDistance, minViewDistance, maxViewDistance);

        setScrollRate();
    }
}